

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::(anonymous_namespace)::StringifyDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  CppType CVar4;
  uint32 uVar5;
  uint uVar6;
  Type TVar7;
  protobuf *ppVar8;
  EnumValueDescriptor *this_00;
  string *src;
  LogMessage *other;
  int i;
  uint i_00;
  int i_01;
  long i_02;
  unsigned_long i_03;
  char *pcVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  allocator local_152;
  LogFinisher local_151;
  LogMessage local_150;
  allocator local_111;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator local_87;
  allocator local_86;
  allocator local_85;
  float local_84;
  undefined1 local_80 [4];
  float value_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  double local_38;
  double value;
  allocator local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)this);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"[]",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    CVar4 = FieldDescriptor::cpp_type(local_18);
    switch(CVar4) {
    case CPPTYPE_INT32:
      uVar6 = FieldDescriptor::default_value_int32(local_18);
      SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar6,i);
      break;
    case CPPTYPE_INT64:
      ppVar8 = (protobuf *)FieldDescriptor::default_value_int64(local_18);
      SimpleItoa_abi_cxx11_(__return_storage_ptr__,ppVar8,i_02);
      break;
    case CPPTYPE_UINT32:
      uVar5 = FieldDescriptor::default_value_uint32(local_18);
      SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar5,i_00);
      break;
    case CPPTYPE_UINT64:
      ppVar8 = (protobuf *)FieldDescriptor::default_value_uint64(local_18);
      SimpleItoa_abi_cxx11_(__return_storage_ptr__,ppVar8,i_03);
      break;
    case CPPTYPE_DOUBLE:
      dVar12 = FieldDescriptor::default_value_double(local_18);
      local_38 = dVar12;
      dVar13 = std::numeric_limits<double>::infinity();
      dVar2 = local_38;
      if ((dVar12 != dVar13) || (NAN(dVar12) || NAN(dVar13))) {
        dVar12 = std::numeric_limits<double>::infinity();
        if ((dVar2 != -dVar12) || (NAN(dVar2) || NAN(-dVar12))) {
          if (NAN(local_38)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)__return_storage_ptr__,"(1e10000 * 0)",&local_3b)
            ;
            std::allocator<char>::~allocator((allocator<char> *)&local_3b);
          }
          else {
            SimpleDtoa_abi_cxx11_((string *)local_80,(protobuf *)this,local_38);
            std::operator+(&local_60,"float(",(string *)local_80);
            std::operator+(__return_storage_ptr__,&local_60,")");
            std::__cxx11::string::~string((string *)&local_60);
            std::__cxx11::string::~string((string *)local_80);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"-1e10000",&local_3a);
          std::allocator<char>::~allocator((allocator<char> *)&local_3a);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"1e10000",&local_39);
        std::allocator<char>::~allocator((allocator<char> *)&local_39);
      }
      break;
    case CPPTYPE_FLOAT:
      fVar10 = FieldDescriptor::default_value_float(local_18);
      local_84 = fVar10;
      fVar11 = std::numeric_limits<float>::infinity();
      fVar1 = local_84;
      if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
        fVar10 = std::numeric_limits<float>::infinity();
        if ((fVar1 != -fVar10) || (NAN(fVar1) || NAN(-fVar10))) {
          if (NAN(local_84)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)__return_storage_ptr__,"(1e10000 * 0)",&local_87)
            ;
            std::allocator<char>::~allocator((allocator<char> *)&local_87);
          }
          else {
            SimpleFtoa_abi_cxx11_(&local_c8,(protobuf *)this,local_84);
            std::operator+(&local_a8,"float(",&local_c8);
            std::operator+(__return_storage_ptr__,&local_a8,")");
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_c8);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"-1e10000",&local_86);
          std::allocator<char>::~allocator((allocator<char> *)&local_86);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"1e10000",&local_85);
        std::allocator<char>::~allocator((allocator<char> *)&local_85);
      }
      break;
    case CPPTYPE_BOOL:
      bVar3 = FieldDescriptor::default_value_bool(local_18);
      pcVar9 = "False";
      if (bVar3) {
        pcVar9 = "True";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar9,&local_c9);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      break;
    case CPPTYPE_ENUM:
      this_00 = FieldDescriptor::default_value_enum(local_18);
      uVar6 = EnumValueDescriptor::number(this_00);
      SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar6,i_01);
      break;
    case CPPTYPE_STRING:
      src = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
      CEscape(&local_110,src);
      std::operator+(&local_f0,"_b(\"",&local_110);
      TVar7 = FieldDescriptor::type(local_18);
      pcVar9 = "\").decode(\'utf-8\')";
      if (TVar7 != TYPE_STRING) {
        pcVar9 = "\")";
      }
      std::operator+(__return_storage_ptr__,&local_f0,pcVar9);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      break;
    case CPPTYPE_MESSAGE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"None",&local_111);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_150,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
                 ,0x117);
      other = internal::LogMessage::operator<<(&local_150,"Not reached.");
      internal::LogFinisher::operator=(&local_151,other);
      internal::LogMessage::~LogMessage(&local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_152);
      std::allocator<char>::~allocator((allocator<char> *)&local_152);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string StringifyDefaultValue(const FieldDescriptor& field) {
  if (field.is_repeated()) {
    return "[]";
  }

  switch (field.cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return SimpleItoa(field.default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return SimpleItoa(field.default_value_uint32());
    case FieldDescriptor::CPPTYPE_INT64:
      return SimpleItoa(field.default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(field.default_value_uint64());
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field.default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        // Python pre-2.6 on Windows does not parse "inf" correctly.  However,
        // a numeric literal that is too big for a double will become infinity.
        return "1e10000";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        // See above.
        return "-1e10000";
      } else if (value != value) {
        // infinity * 0 = nan
        return "(1e10000 * 0)";
      } else {
        return "float(" + SimpleDtoa(value) + ")";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field.default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        // Python pre-2.6 on Windows does not parse "inf" correctly.  However,
        // a numeric literal that is too big for a double will become infinity.
        return "1e10000";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        // See above.
        return "-1e10000";
      } else if (value != value) {
        // infinity - infinity = nan
        return "(1e10000 * 0)";
      } else {
        return "float(" + SimpleFtoa(value) + ")";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field.default_value_bool() ? "True" : "False";
    case FieldDescriptor::CPPTYPE_ENUM:
      return SimpleItoa(field.default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_STRING:
//##!PY25      return "b\"" + CEscape(field.default_value_string()) +
//##!PY25             (field.type() != FieldDescriptor::TYPE_STRING ? "\"" :
//##!PY25               "\".decode('utf-8')");
      return "_b(\"" + CEscape(field.default_value_string()) +  //##PY25
             (field.type() != FieldDescriptor::TYPE_STRING ? "\")" :  //##PY25
               "\").decode('utf-8')");  //##PY25
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "None";
  }
  // (We could add a default case above but then we wouldn't get the nice
  // compiler warning when a new type is added.)
  GOOGLE_LOG(FATAL) << "Not reached.";
  return "";
}